

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void update_xlog(toptenentry *newtt,char *dumpname)

{
  boolean bVar1;
  int fd_00;
  FILE *__stream;
  FILE *xlfile;
  int fd;
  char *dumpname_local;
  toptenentry *newtt_local;
  
  fd_00 = open_datafile("xlogfile",0x441,2);
  bVar1 = lock_fd(fd_00,10);
  if (bVar1 != '\0') {
    __stream = fdopen(fd_00,"a");
    write_xlentry((FILE *)__stream,newtt,dumpname);
    unlock_fd(fd_00);
    fclose(__stream);
  }
  return;
}

Assistant:

static void update_xlog(const struct toptenentry *newtt, const char *dumpname)
{
    /* used for statistical purposes and tournament scoring */
    int fd = open_datafile(XLOGFILE, O_CREAT | O_APPEND | O_WRONLY, SCOREPREFIX);
    if (lock_fd(fd,10)) {
	FILE *xlfile = fdopen(fd, "a");
	write_xlentry(xlfile, newtt, dumpname);
	unlock_fd(fd);
	fclose(xlfile); /* also closes fd */
    }
}